

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O3

BN * __thiscall BN::operator+=(BN *this,BN *bn)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  iterator __position;
  size_t pos;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  uint local_14;
  
  uVar4 = (long)(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start >> 1;
  uVar6 = (long)(bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                .super__Vector_impl_data._M_finish -
          (long)(bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                .super__Vector_impl_data._M_start >> 1;
  if (uVar6 < uVar4) {
    uVar6 = uVar4;
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&this->ba,uVar6);
  puVar1 = (bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar6 = (long)puVar2 - (long)puVar1 >> 1;
  puVar3 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 == puVar1) {
    uVar5 = 0;
  }
  else {
    lVar7 = 0;
    uVar5 = 0;
    do {
      uVar5 = (uint)puVar1[lVar7] + (uint)puVar3[lVar7] + (uVar5 >> 0x10);
      puVar3[lVar7] = (unsigned_short)uVar5;
      lVar7 = lVar7 + 1;
    } while (uVar6 + (uVar6 == 0) != lVar7);
  }
  __position._M_current =
       (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uVar4 = (long)__position._M_current - (long)puVar3 >> 1;
  if (uVar6 < uVar4) {
    do {
      uVar5 = (uint)puVar3[uVar6] + (uVar5 >> 0x10);
      puVar3[uVar6] = (unsigned_short)uVar5;
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (0xffff < uVar5) {
    if (__position._M_current ==
        (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_short,std::allocator<unsigned_short>>::_M_realloc_insert<unsigned_int&>
                ((vector<unsigned_short,std::allocator<unsigned_short>> *)this,__position,&local_14)
      ;
    }
    else {
      *__position._M_current = (unsigned_short)(uVar5 >> 0x10);
      (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  return this;
}

Assistant:

BN& BN::operator += (const BN& bn) {
    ba.resize(max(ba.size(), bn.ba.size()));

    bt2 sum = 0;
    for(size_t pos = 0; pos < bn.ba.size(); pos++) {
        sum = (sum >> bz8) + ba[pos] + bn.ba[pos];
        ba[pos] = sum;
    }

    for(size_t pos = bn.ba.size(); pos < ba.size(); pos++) {
        sum = (sum >> bz8) + ba[pos];
        ba[pos] = sum;
    }
    sum >>= bz8;
    if (sum)
        ba.emplace_back(sum);
    return *this;
}